

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int mllr_mat(float32 *****out_A,float32 ****out_B,char *var_fn,vector_t ***mean,vector_t ***wt_mean,
            float32 ***wt_dcount,uint32 gau_begin,int32 *cb2mllr,uint32 mllr_mult,uint32 mllr_add,
            float32 varfloor,uint32 n_mgau,uint32 n_stream,uint32 n_density,uint32 n_mllr_class,
            uint32 *veclen)

{
  size_t d2;
  uint uVar1;
  vector_t *ppfVar2;
  vector_t pfVar3;
  float32 **ppfVar4;
  float32 *pfVar5;
  float32 *pfVar6;
  float32 *****regl;
  int iVar7;
  int32 iVar8;
  cmd_ln_t *cmdln;
  long lVar9;
  float32 ****ppppfVar10;
  float32 ***pppfVar11;
  float32 **ppfVar12;
  ulong uVar13;
  char *fmt;
  ulong uVar14;
  vector_t pfVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  size_t d1;
  float fVar22;
  float fVar23;
  float fVar24;
  uint32 n_density_rd;
  uint32 n_stream_rd;
  uint32 n_mgau_rd;
  float32 *****local_f0;
  uint32 *veclen_rd;
  ulong local_e0;
  vector_t ***var;
  ulong local_d0;
  float32 ****local_c8;
  ulong local_c0;
  ulong local_b8;
  float32 ***local_b0;
  vector_t ***local_a8;
  vector_t ***local_a0;
  float32 *local_98;
  vector_t ****fullvar;
  float32 ***B;
  float32 ****A;
  float32 ****local_78;
  float32 *****local_70;
  ulong local_68;
  long local_60;
  vector_t ***local_58;
  ulong local_50;
  float32 ***local_48;
  vector_t local_40;
  vector_t local_38;
  
  local_f0 = (float32 *****)CONCAT44(local_f0._4_4_,varfloor);
  var = (vector_t ***)0x0;
  A = (float32 ****)0x0;
  B = (float32 ***)0x0;
  veclen_rd = (uint32 *)0x0;
  local_b0 = wt_dcount;
  local_a8 = mean;
  local_a0 = wt_mean;
  local_70 = out_A;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x7f,"\n");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x80," ---- mllr_solve(): Conventional MLLR method\n");
  cmdln = cmd_ln_get();
  lVar9 = cmd_ln_int_r(cmdln,"-fullvar");
  if ((int)lVar9 == 0) {
    iVar7 = s3gau_read(var_fn,&var,&n_mgau_rd,&n_stream_rd,&n_density_rd,&veclen_rd);
    if (iVar7 != 0) {
      lVar9 = 0xa3;
      goto LAB_001030fb;
    }
  }
  else {
    iVar7 = s3gau_read_full(var_fn,&fullvar,&n_mgau_rd,&n_stream_rd,&n_density_rd,&veclen_rd);
    if (iVar7 != 0) {
      lVar9 = 0x8e;
LAB_001030fb:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
              ,lVar9,"Couldn\'t read %s",var_fn);
      goto LAB_00103047;
    }
    var = gauden_alloc_param(n_mgau_rd,n_stream_rd,n_density_rd,veclen_rd);
    if ((ulong)n_mgau_rd != 0) {
      uVar18 = 0;
      do {
        if ((ulong)n_stream_rd != 0) {
          uVar19 = 0;
          do {
            if ((ulong)n_density_rd != 0) {
              uVar1 = veclen_rd[uVar19];
              uVar14 = 0;
              do {
                if ((ulong)uVar1 != 0) {
                  ppfVar2 = fullvar[uVar18][uVar19][uVar14];
                  pfVar3 = var[uVar18][uVar19][uVar14];
                  uVar21 = 0;
                  do {
                    pfVar3[uVar21] = ppfVar2[uVar21][uVar21];
                    uVar21 = uVar21 + 1;
                  } while (uVar1 != uVar21);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != n_density_rd);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != n_stream_rd);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != n_mgau_rd);
    }
    gauden_free_param_full(fullvar);
  }
  if (n_mgau_rd == n_mgau) {
    if (n_stream_rd == n_stream) {
      if (n_density_rd == n_density) {
        uVar18 = (ulong)n_stream;
        if (n_stream != 0) {
          uVar19 = 0;
          do {
            if (veclen[uVar19] != veclen_rd[uVar19]) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                      ,0xb3,"vector length of stream %u (== %u) != prior length (== %u)\n",uVar19,
                      (ulong)veclen_rd[uVar19],(ulong)veclen[uVar19]);
              goto LAB_00103047;
            }
            uVar19 = uVar19 + 1;
          } while (uVar18 != uVar19);
        }
        local_78 = out_B;
        ckd_free(veclen_rd);
        veclen_rd = (uint32 *)0x0;
        local_68 = (ulong)n_mgau;
        local_50 = (ulong)n_density;
        if (n_mgau != 0) {
          uVar19 = 0;
          do {
            if (n_stream != 0) {
              uVar14 = 0;
              do {
                if (n_density != 0) {
                  uVar1 = veclen[uVar14];
                  uVar21 = 0;
                  do {
                    if ((ulong)uVar1 != 0) {
                      pfVar3 = var[uVar19][uVar14][uVar21];
                      uVar20 = 0;
                      do {
                        fVar22 = pfVar3[uVar20];
                        fVar24 = 0.5;
                        if ((0.0 < fVar22) &&
                           (fVar24 = 1.0 / local_f0._0_4_, local_f0._0_4_ <= fVar22)) {
                          fVar24 = 1.0 / fVar22;
                        }
                        pfVar3[uVar20] = fVar24;
                        uVar20 = uVar20 + 1;
                      } while (uVar1 != uVar20);
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != local_50);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar18);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != local_68);
        }
        fputc(10,_stderr);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0xd0," ---- A. Accum regl, regr\n");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0xd1," No classes %d, no. stream %d\n",(ulong)n_mllr_class);
        uVar19 = (ulong)n_mllr_class;
        local_f0 = (float32 *****)
                   __ckd_calloc_2d__(uVar19,uVar18,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                     ,0xd4);
        local_b8 = uVar19;
        ppppfVar10 = (float32 ****)
                     __ckd_calloc_2d__(uVar19,uVar18,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                       ,0xd6);
        local_d0 = uVar18;
        local_c8 = ppppfVar10;
        if (n_mllr_class != 0) {
          uVar18 = 0;
          do {
            if (n_stream != 0) {
              uVar19 = 0;
              do {
                d1 = (size_t)(int)veclen[uVar19];
                d2 = d1 + 1;
                pppfVar11 = (float32 ***)
                            __ckd_calloc_3d__(d1,d2,d2,4,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                              ,0xdb);
                local_f0[uVar18][uVar19] = pppfVar11;
                ppfVar12 = (float32 **)
                           __ckd_calloc_2d__(d1,d2,4,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                             ,0xdc);
                ppppfVar10[uVar18][uVar19] = ppfVar12;
                uVar19 = uVar19 + 1;
              } while (local_d0 != uVar19);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != local_b8);
        }
        if (gau_begin < n_mgau) {
          uVar18 = (ulong)gau_begin;
          do {
            local_c0 = uVar18;
            local_60 = (long)cb2mllr[local_c0];
            if (-1 < local_60 && n_stream != 0) {
              local_e0 = 0;
              do {
                if (n_density != 0) {
                  uVar1 = veclen[local_e0];
                  uVar19 = (ulong)uVar1;
                  local_98 = local_b0[local_c0][local_e0];
                  local_58 = var;
                  uVar18 = 0;
                  do {
                    if ((0.0 < (float)local_98[uVar18]) && (uVar1 != 0)) {
                      pfVar3 = local_a8[local_c0][local_e0][uVar18];
                      local_38 = local_a0[local_c0][local_e0][uVar18];
                      local_40 = var[local_c0][local_e0][uVar18];
                      local_48 = local_f0[local_60][local_e0];
                      ppfVar12 = local_c8[local_60][local_e0];
                      uVar14 = 0;
                      do {
                        fVar22 = local_38[uVar14] * local_40[uVar14];
                        fVar24 = local_40[uVar14] * (float)local_98[uVar18];
                        ppfVar4 = local_48[uVar14];
                        pfVar5 = ppfVar12[uVar14];
                        lVar9 = 0;
                        uVar20 = 0;
                        pfVar15 = pfVar3;
                        uVar21 = uVar19;
                        do {
                          fVar23 = pfVar3[uVar20] * fVar24;
                          pfVar6 = ppfVar4[uVar20];
                          uVar13 = 0;
                          do {
                            *(float *)((long)pfVar6 + uVar13 * 4 + lVar9) =
                                 pfVar15[uVar13] * fVar23 +
                                 *(float *)((long)pfVar6 + uVar13 * 4 + lVar9);
                            uVar13 = uVar13 + 1;
                          } while (uVar21 != uVar13);
                          pfVar6[(int)uVar1] = (float32)(fVar23 + (float)pfVar6[(int)uVar1]);
                          pfVar5[uVar20] =
                               (float32)(pfVar3[uVar20] * fVar22 + (float)pfVar5[uVar20]);
                          uVar20 = uVar20 + 1;
                          pfVar15 = pfVar15 + 1;
                          lVar9 = lVar9 + 4;
                          uVar21 = uVar21 - 1;
                        } while (uVar20 != uVar19);
                        pfVar6 = ppfVar4[(int)uVar1];
                        pfVar6[(int)uVar1] = (float32)(fVar24 + (float)pfVar6[(int)uVar1]);
                        pfVar5[(int)uVar1] = (float32)(fVar22 + (float)pfVar5[(int)uVar1]);
                        uVar14 = uVar14 + 1;
                      } while (uVar14 != uVar19);
                    }
                    uVar18 = uVar18 + 1;
                  } while (uVar18 != local_50);
                }
                local_e0 = local_e0 + 1;
              } while (local_e0 != local_d0);
            }
            uVar18 = local_c0 + 1;
          } while (local_c0 + 1 != local_68);
        }
        gauden_free_param(local_a8);
        gauden_free_param(local_a0);
        ckd_free_3d(local_b0);
        if (n_mllr_class != 0) {
          uVar18 = 0;
          do {
            if (n_stream != 0) {
              uVar19 = 0;
              do {
                uVar1 = veclen[uVar19];
                uVar14 = (ulong)uVar1;
                if (uVar14 != 0) {
                  uVar21 = 0;
                  do {
                    uVar20 = 0;
                    do {
                      uVar13 = uVar20 + 1;
                      if (uVar20 < uVar14) {
                        ppfVar12 = local_f0[uVar18][uVar19][uVar21];
                        pfVar5 = ppfVar12[uVar20];
                        uVar17 = uVar13 & 0xffffffff;
                        do {
                          ppfVar12[uVar17][uVar20] = pfVar5[uVar17];
                          uVar16 = (int)uVar17 + 1;
                          uVar17 = (ulong)uVar16;
                        } while (uVar16 <= uVar1);
                      }
                      uVar20 = uVar13;
                    } while (uVar13 != uVar1 + 1 + (uint)(uVar1 == 0xffffffff));
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != uVar14);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != local_d0);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != local_b8);
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0x119," ---- B. Compute MLLR matrices (A,B)\n");
        ppppfVar10 = local_c8;
        regl = local_f0;
        iVar8 = compute_mllr(local_f0,local_c8,veclen,n_mllr_class,n_stream,mllr_mult,mllr_add,&A,&B
                            );
        if (iVar8 == 0) {
          free_mllr_reg(regl,ppppfVar10,n_mllr_class,n_stream);
          *local_70 = A;
          *local_78 = B;
          return 0;
        }
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0x123,"MLLR computation failed\n");
        goto LAB_00103047;
      }
      fmt = "n_density mismatch (%u : %u)\n";
      lVar9 = 0xae;
      uVar18 = (ulong)n_density;
    }
    else {
      fmt = "n_stream mismatch (%u : %u)\n";
      lVar9 = 0xab;
      uVar18 = (ulong)n_stream;
    }
  }
  else {
    fmt = "n_mgau mismatch (%u : %u)\n";
    lVar9 = 0xa8;
    uVar18 = (ulong)n_mgau;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,lVar9,fmt,uVar18);
LAB_00103047:
  exit(1);
}

Assistant:

int 
mllr_mat(float32 	*****out_A, 
      	float32 	****out_B, 
  	const char 	*var_fn, 
  	vector_t 	***mean, 
        vector_t        ***wt_mean,             /* read from bw accum */
	float32         ***wt_dcount,           /* read from bw accum */
  	uint32 		gau_begin, 
  	int32 		*cb2mllr, 
  	uint32 		mllr_mult,		
  	uint32 		mllr_add,		
  	float32		varfloor, 
  	uint32 		n_mgau, 
  	uint32 		n_stream, 
  	uint32 		n_density, 
  	uint32 		n_mllr_class, 
  	const uint32 	*veclen) 


{
      vector_t 	***var  	= NULL; 
      float32 	****A  		= NULL;		
      float32 	***B   		= NULL; 	

      float32 	*****regl  	= NULL; 
      float32 	****regr   	= NULL; 

      float32     wt_mean_var;
      float32     wt_dcount_var;
      float32     wt_dcount_var_mean;

      float32	*tmean		= NULL; 
      uint32 	n_mgau_rd; 
      uint32 	n_stream_rd; 
      uint32 	n_density_rd; 

      uint32    *veclen_rd	= NULL; 

      uint32 i, j, k, l, s, p , q;
      int32 m, mc;
      int32 len=0;

      /*      uint32 	i, j, k, l, p, q, s; 
	      int32	m, mc, mi; */

      E_INFO("\n");
      E_INFO(" ---- mllr_solve(): Conventional MLLR method\n"); 

      if (cmd_ln_int32("-fullvar")) {
	  /* Extract diagonals to solve MLLR (we are not doing
	     variance adaptation, yet) */
	  vector_t ****fullvar;
	  uint32 i, j, k, l;

	  if (s3gau_read_full(var_fn, 
			      &fullvar, 
			      &n_mgau_rd, 
			      &n_stream_rd, 
			      &n_density_rd, 
			      &veclen_rd) != S3_SUCCESS) { 
	      E_FATAL("Couldn't read %s", var_fn); 
	  } 
	  var = gauden_alloc_param(n_mgau_rd,
				   n_stream_rd,
				   n_density_rd,
				   veclen_rd);
	  for (i = 0; i < n_mgau_rd; ++i)
	      for (j = 0; j < n_stream_rd; ++j)
		  for (k = 0; k < n_density_rd; ++k)
		      for (l = 0; l < veclen_rd[j]; ++l)
			  var[i][j][k][l] =
			      fullvar[i][j][k][l][l];
	  gauden_free_param_full(fullvar);
      }
      else {
	  if (s3gau_read(var_fn, 
			 &var, 
			 &n_mgau_rd, 
			 &n_stream_rd, 
			 &n_density_rd, 
			 &veclen_rd) != S3_SUCCESS) { 
	      E_FATAL("Couldn't read %s", var_fn); 
	  } 
      }

      if (n_mgau != n_mgau_rd) { 
  	E_FATAL("n_mgau mismatch (%u : %u)\n",n_mgau,n_mgau_rd); 
      } 
      if (n_stream != n_stream_rd) { 
  	E_FATAL("n_stream mismatch (%u : %u)\n",n_stream,n_stream_rd); 
      } 
      if (n_density != n_density_rd) { 
  	E_FATAL("n_density mismatch (%u : %u)\n",n_density,n_density_rd); 
      } 
      for (s = 0; s < n_stream; s++) { 
  	if (veclen[s] != veclen_rd[s]) { 
  	    E_FATAL("vector length of stream %u (== %u) " 
  		    "!= prior length (== %u)\n", s, veclen_rd[s], veclen[s]); 
  	} 
      } 
      ckd_free((void *)veclen_rd); 
      veclen_rd = NULL; 


      /* Invert variances. */
      for (i = 0; i < n_mgau; i++) { 
          for (j = 0; j < n_stream; j++) { 
              for (k = 0; k < n_density; k++) { 
                  for (l = 0; l < veclen[j]; l++) { 
                      if (var[i][j][k][l] <= 0.) { 
  			var[i][j][k][l] = VAR_CONST;	
  		    } 
  		    else if (var[i][j][k][l] < varfloor) { 
  			var[i][j][k][l] = 1. / varfloor; 
  		    } 
  		    else { 
  		        var[i][j][k][l] = 1. / var[i][j][k][l]; 
  		    } 
                  } 
              } 
          } 
      } 


      fprintf(stderr,"\n"); 

      E_INFO(" ---- A. Accum regl, regr\n"); 
      E_INFO(" No classes %d, no. stream %d\n",n_mllr_class,n_stream);

      /* Legetter's set of G matrices, one per dimension per class. */
      regl = (float32 *****)ckd_calloc_2d(n_mllr_class, n_stream, sizeof(float32 ***)); 
      /* Legetter's Z matrices, one per class. */
      regr = (float32 ****) ckd_calloc_2d(n_mllr_class, n_stream, sizeof(float32 **)); 
      
      for (i = 0; i < n_mllr_class; i++) { 
          for (j = 0; j < n_stream; j++) { 
              len = veclen[j]; 
              regl[i][j] = (float32 ***)ckd_calloc_3d(len, len+1, len+1, sizeof(float32)); 
              regr[i][j] = (float32 **) ckd_calloc_2d(len, len+1, sizeof(float32)); 
          } 
      } 
      
      /*      E_INFO(" Checking\n");*/

      for (i = gau_begin; i < n_mgau; i++) { 
        mc = cb2mllr[i]; 
	if (mc < 0) continue;	/* skip */

        for (j = 0; j < n_stream; j++) { 
	  len=veclen[j];

	  for (k = 0; k < n_density; k++) { 
	    if (wt_dcount[i][j][k] > 0.) { 
	      tmean = mean[i][j][k]; 
	      for (l = 0; l < len; l++) { 
		wt_mean_var   = wt_mean[i][j][k][l] * var[i][j][k][l]; 
		wt_dcount_var = wt_dcount[i][j][k]  * var[i][j][k][l]; 
		
		for (p = 0; p < len; p++) { 
		  wt_dcount_var_mean = wt_dcount_var * tmean[p]; 
		  for (q = p; q < len; q++) { 
		    /* This is g(l)_{pq} = sum_r(v_{ii}(r) d_{pq}(r))*/
		    /* or in other words sum(likelihood * invvar * outer(mean, mean)) */
		    regl[mc][j][l][p][q] += (float32) (wt_dcount_var_mean * tmean[q]); 
		  } 
		  /* G corresponding to extended element of q. */
		  regl[mc][j][l][p][len] += (float32)(wt_dcount_var_mean); 
		  /* This is z_{lp} = sum(likelihood * invvar * obs * mean_p) */
		  regr[mc][j][l][p] += (float32)(wt_mean_var * tmean[p]); 
		} 
		/* G corresponding to extended element of p and q. */
		/* Question: what about regl[mc][j][l][len][0..len]? */
		/* Answer: G(l) is symmetric, so we already calculated them. */
		regl[mc][j][l][len][len] += (float32)wt_dcount_var; 
		/* Z corresponding to extended element of p. */
		regr[mc][j][l][len] += (float32)(wt_mean_var); 
	      } 
	    } 
	  } 
	} 
      }

      gauden_free_param(mean); 
      gauden_free_param(wt_mean); 
      ckd_free_3d((void ***)wt_dcount); 

      /* Fill in the lower triangular part of regl. */
      for (m = 0; m < n_mllr_class; m++) { 
        for (j = 0; j < n_stream; j++) { 
	  for (l = 0; l < veclen[j]; l++) { 
	    for (p = 0; p <= veclen[j]; p++) { 
	      for (q = p+1; q <= veclen[j]; q++) { 
		regl[m][j][l][q][p] = regl[m][j][l][p][q]; 
	      } 
	    } 
	  } 
        } 
      } 

      E_INFO(" ---- B. Compute MLLR matrices (A,B)\n"); 
      if(compute_mllr(regl, 
  		    regr, 
  		    veclen, 
  		    n_mllr_class, 
  		    n_stream, 
  		    mllr_mult, 
  		    mllr_add, 
  		    &A, 
  		    &B) != S3_SUCCESS) {  
  	E_FATAL("MLLR computation failed\n"); 
      } 

      free_mllr_reg(regl,regr, n_mllr_class, n_stream); 

      *out_A = A; 
      *out_B = B; 

      return S3_SUCCESS; 
}